

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::
MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
describe(string *__return_storage_ptr__,
        MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  string local_38;
  MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = this;
  this_local = (MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  MatcherUntypedBase::toString_abi_cxx11_
            (&local_38,&this->m_underlyingMatcher->super_MatcherUntypedBase);
  std::operator+(__return_storage_ptr__,"not ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const override {
                return "not " + m_underlyingMatcher.toString();
            }